

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

int mbedtls_md5_self_test(int verbose)

{
  long lVar1;
  undefined1 auVar2 [16];
  uchar md5sum [16];
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  lVar1 = 0;
  while( true ) {
    if (verbose != 0) {
      printf("  MD5 test #%d: ",(ulong)((int)lVar1 + 1));
    }
    mbedtls_md5(md5_test_buf[lVar1],(long)md5_test_buflen[lVar1],&local_48);
    auVar2[0] = -(md5_test_sum[lVar1][0] == local_48);
    auVar2[1] = -(md5_test_sum[lVar1][1] == uStack_47);
    auVar2[2] = -(md5_test_sum[lVar1][2] == uStack_46);
    auVar2[3] = -(md5_test_sum[lVar1][3] == uStack_45);
    auVar2[4] = -(md5_test_sum[lVar1][4] == uStack_44);
    auVar2[5] = -(md5_test_sum[lVar1][5] == uStack_43);
    auVar2[6] = -(md5_test_sum[lVar1][6] == uStack_42);
    auVar2[7] = -(md5_test_sum[lVar1][7] == uStack_41);
    auVar2[8] = -(md5_test_sum[lVar1][8] == uStack_40);
    auVar2[9] = -(md5_test_sum[lVar1][9] == uStack_3f);
    auVar2[10] = -(md5_test_sum[lVar1][10] == uStack_3e);
    auVar2[0xb] = -(md5_test_sum[lVar1][0xb] == uStack_3d);
    auVar2[0xc] = -(md5_test_sum[lVar1][0xc] == uStack_3c);
    auVar2[0xd] = -(md5_test_sum[lVar1][0xd] == uStack_3b);
    auVar2[0xe] = -(md5_test_sum[lVar1][0xe] == uStack_3a);
    auVar2[0xf] = -(md5_test_sum[lVar1][0xf] == uStack_39);
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
        != 0xffff) break;
    if (verbose == 0) {
      lVar1 = lVar1 + 1;
      if (lVar1 == 7) {
        return 0;
      }
    }
    else {
      puts("passed");
      lVar1 = lVar1 + 1;
      if (lVar1 == 7) {
        putchar(10);
        return 0;
      }
    }
  }
  if (verbose != 0) {
    puts("failed");
    return 1;
  }
  return 1;
}

Assistant:

int mbedtls_md5_self_test( int verbose )
{
    int i;
    unsigned char md5sum[16];

    for( i = 0; i < 7; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  MD5 test #%d: ", i + 1 );

        mbedtls_md5( md5_test_buf[i], md5_test_buflen[i], md5sum );

        if( memcmp( md5sum, md5_test_sum[i], 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}